

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fork.c
# Opt level: O2

void timer_cb_touch(uv_timer_t *timer)

{
  uv_close(timer,0);
  touch_file("watch_file");
  timer_cb_touch_called = timer_cb_touch_called + 1;
  return;
}

Assistant:

static void timer_cb_touch(uv_timer_t* timer) {
  uv_close((uv_handle_t*)timer, NULL);
  touch_file("watch_file");
  timer_cb_touch_called++;
}